

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  cTValue *pcVar1;
  SBuf *sb;
  uint64_t uVar2;
  cTValue *pcVar3;
  GCstr *pGVar4;
  lua_Number lVar5;
  cTValue *pcVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  MSize len;
  int iVar10;
  int iVar11;
  ulong uVar12;
  void *q;
  
  iVar11 = -left;
  if (0 < left) {
    iVar11 = left;
  }
  lVar5 = (lua_Number)top->u64;
  while( true ) {
    uVar7 = (long)lVar5 >> 0x2f;
    if ((0xfffffffffffffff2 < uVar7 && uVar7 != 0xfffffffffffffffb) &&
       ((uVar7 != 0xfffffffffffffff3 || (*(char *)(((ulong)lVar5 & 0x7fffffffffff) + 10) != '\x03'))
       )) break;
    uVar12 = top[-1].it64 >> 0x2f;
    if ((0xfffffffffffffff2 < uVar12 && uVar12 != 0xfffffffffffffffb) &&
       ((uVar12 != 0xfffffffffffffff3 ||
        (*(char *)((top[-1].it64 & 0x7fffffffffffU) + 10) != '\x03')))) break;
    uVar9 = 0x20;
    if (uVar7 == 0xfffffffffffffff3) {
      uVar7 = (ulong)lVar5 & 0x7fffffffffff;
      if (*(char *)(uVar7 + 10) == '\x03') {
        uVar9 = *(int *)(uVar7 + 0x30) - *(int *)(uVar7 + 0x58);
      }
    }
    else {
      uVar9 = 0x20;
      if (uVar7 == 0xfffffffffffffffb) {
        uVar9 = *(uint *)(((ulong)lVar5 & 0x7fffffffffff) + 0x14);
      }
    }
    uVar7 = (ulong)uVar9;
    pcVar6 = top;
    do {
      iVar10 = iVar11;
      pcVar3 = pcVar6 + -1;
      lVar5 = (lua_Number)pcVar3->u64;
      if ((long)lVar5 >> 0x2f == -0xd) {
        uVar12 = (ulong)lVar5 & 0x7fffffffffff;
        uVar8 = 0x20;
        if (*(char *)(uVar12 + 10) == '\x03') {
          uVar8 = (ulong)(uint)(*(int *)(uVar12 + 0x30) - *(int *)(uVar12 + 0x58));
        }
      }
      else {
        uVar8 = 0x20;
        if ((long)lVar5 >> 0x2f == -5) {
          uVar8 = (ulong)*(uint *)(((ulong)lVar5 & 0x7fffffffffff) + 0x14);
        }
      }
      uVar7 = uVar7 + uVar8;
    } while ((1 < iVar10) &&
            (pcVar1 = pcVar6 + -2, iVar11 = iVar10 + -1, pcVar6 = pcVar3,
            (ulong)(pcVar1->it64 >> 0x2f) < 0xfffffffffffffff3 ||
            pcVar1->it64 >> 0x2f == 0xfffffffffffffffb));
    if (0x7ffffeff < uVar7) {
      lj_err_msg(L,LJ_ERR_STROV);
    }
    uVar2 = (L->glref).ptr64;
    sb = (SBuf *)(uVar2 + 200);
    *(lua_State **)(uVar2 + 0xe0) = L;
    *(undefined8 *)(uVar2 + 200) = *(undefined8 *)(uVar2 + 0xd8);
    if ((uint)(*(int *)(uVar2 + 0xd0) - (int)*(undefined8 *)(uVar2 + 0xd8)) < (uint)uVar7) {
      lj_buf_more2(sb,(uint)uVar7);
    }
    iVar11 = iVar10 + -1;
    for (pcVar6 = pcVar3; pcVar6 <= top; pcVar6 = pcVar6 + 1) {
      lVar5 = (lua_Number)pcVar6->u64;
      if ((long)lVar5 >> 0x2f == -0xd) {
        uVar7 = (ulong)lVar5 & 0x7fffffffffff;
        if (*(char *)(uVar7 + 10) == '\x03') {
          q = *(void **)(uVar7 + 0x58);
          len = *(int *)(uVar7 + 0x30) - (int)q;
          goto LAB_00126f8a;
        }
LAB_00126f94:
        lj_strfmt_putfnum(sb,0xf000035,lVar5);
      }
      else {
        if ((long)lVar5 >> 0x2f != -5) goto LAB_00126f94;
        len = *(MSize *)(((ulong)lVar5 & 0x7fffffffffff) + 0x14);
        q = (void *)(((ulong)lVar5 & 0x7fffffffffff) + 0x18);
LAB_00126f8a:
        lj_buf_putmem(sb,q,len);
      }
    }
    pGVar4 = lj_str_new(L,*(char **)(uVar2 + 0xd8),
                        (ulong)(uint)(*(int *)(uVar2 + 200) - (int)*(char **)(uVar2 + 0xd8)));
    lVar5 = (lua_Number)((ulong)pGVar4 | 0xfffd800000000000);
    pcVar3->u64 = (uint64_t)lVar5;
    top = pcVar3;
    if (iVar10 < 2) {
      uVar2 = (L->glref).ptr64;
      if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
        if (-1 < left) {
          L->top = L->base + *(byte *)(*(long *)((L->base[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d)
          ;
        }
        lj_gc_step(L);
      }
      return (TValue *)0x0;
    }
  }
  pcVar6 = lj_meta_lookup(L,top + -1,MM_concat);
  if ((pcVar6->u64 == 0xffffffffffffffff) &&
     (pcVar6 = lj_meta_lookup(L,top,MM_concat), pcVar6->u64 == 0xffffffffffffffff)) {
    lj_err_optype(L,top + ((ulong)((ulong)(top[-1].it64 >> 0x2f) < 0xfffffffffffffff3 ||
                                  top[-1].it64 >> 0x2f == 0xfffffffffffffffb) - 1),LJ_ERR_OPCAT);
  }
  top[3] = top[-1];
  top[4] = *top;
  top[1] = *pcVar6;
  top[-1].n = (lua_Number)lj_cont_cat;
  top->u64 = 0xffffffffffffffff;
  top[2].u64 = 0xffffffffffffffff;
  return top + 3;
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    if (!(tvisstr(top) || tvisnumber(top) || tvisbuf(top)) ||
	!(tvisstr(top-1) || tvisnumber(top-1) || tvisbuf(top-1))) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2*LJ_FR2+2, top);  /* Carefully ordered stack copies! */
      copyTV(L, top+2*LJ_FR2+1, top-1);
      copyTV(L, top+LJ_FR2, mo);
      setcont(top-1, lj_cont_cat);
      if (LJ_FR2) { setnilV(top); setnilV(top+2); top += 2; }
      return top+1;  /* Trigger metamethod call. */
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      TValue *e, *o = top;
      uint64_t tlen = tvisstr(o) ? strV(o)->len :
		      tvisbuf(o) ? sbufxlen(bufV(o)) : STRFMT_MAXBUF_NUM;
      SBuf *sb;
      do {
	o--; tlen += tvisstr(o) ? strV(o)->len :
		     tvisbuf(o) ? sbufxlen(bufV(o)) : STRFMT_MAXBUF_NUM;
      } while (--left > 0 && (tvisstr(o-1) || tvisnumber(o-1)));
      if (tlen >= LJ_MAX_STR) lj_err_msg(L, LJ_ERR_STROV);
      sb = lj_buf_tmp_(L);
      lj_buf_more(sb, (MSize)tlen);
      for (e = top, top = o; o <= e; o++) {
	if (tvisstr(o)) {
	  GCstr *s = strV(o);
	  MSize len = s->len;
	  lj_buf_putmem(sb, strdata(s), len);
	} else if (tvisbuf(o)) {
	  SBufExt *sbx = bufV(o);
	  lj_buf_putmem(sb, sbx->r, sbufxlen(sbx));
	} else if (tvisint(o)) {
	  lj_strfmt_putint(sb, intV(o));
	} else {
	  lj_strfmt_putfnum(sb, STRFMT_G14, numV(o));
	}
      }
      setstrV(L, top, lj_buf_str(L, sb));
    }
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}